

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O2

string * __thiscall deci::string_t::ToText_abi_cxx11_(string *__return_storage_ptr__,string_t *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->val);
  return __return_storage_ptr__;
}

Assistant:

std::string string_t::ToText() const {
      return this->val;
    }